

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTestCaseBase.cpp
# Opt level: O0

string * __thiscall
glcts::TestCaseBase::getInfoLog_abi_cxx11_
          (string *__return_storage_ptr__,TestCaseBase *this,LOG_TYPE log_type,GLuint id)

{
  code *pcVar1;
  GLuint GVar2;
  int iVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestError *this_00;
  reference pvVar6;
  allocator<char> local_5a;
  allocator_type local_59;
  undefined1 local_58 [8];
  vector<char,_std::allocator<char>_> result_vec;
  int local_2c;
  long lStack_28;
  GLint n_characters;
  Functions *gl;
  GLuint id_local;
  LOG_TYPE log_type_local;
  TestCaseBase *this_local;
  
  gl._0_4_ = id;
  gl._4_4_ = log_type;
  _id_local = this;
  this_local = (TestCaseBase *)__return_storage_ptr__;
  pRVar5 = deqp::Context::getRenderContext(this->m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  lStack_28 = CONCAT44(extraout_var,iVar3);
  local_2c = 0;
  if (gl._4_4_ == LT_SHADER_OBJECT) {
    (**(code **)(lStack_28 + 0xa70))((GLuint)gl,0x8b84,&local_2c);
  }
  else if (gl._4_4_ == LT_PROGRAM_OBJECT) {
    (**(code **)(lStack_28 + 0x9d8))((GLuint)gl,0x8b84,&local_2c);
  }
  else {
    if (gl._4_4_ != LT_PIPELINE_OBJECT) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid parameter",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/esextcTestCaseBase.cpp"
                 ,0x37a);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (**(code **)(lStack_28 + 0x9a0))((GLuint)gl,0x8b84,&local_2c);
  }
  dVar4 = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(dVar4,"Could not query info log length!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/esextcTestCaseBase.cpp"
                  ,0x37e);
  iVar3 = local_2c + 1;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_58,(long)iVar3,&local_59);
  std::allocator<char>::~allocator(&local_59);
  GVar2 = (GLuint)gl;
  if (gl._4_4_ == LT_SHADER_OBJECT) {
    pcVar1 = *(code **)(lStack_28 + 0xa58);
    iVar3 = local_2c + 1;
    pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_58,0);
    (*pcVar1)(GVar2,iVar3,0,pvVar6);
  }
  else if (gl._4_4_ == LT_PROGRAM_OBJECT) {
    pcVar1 = *(code **)(lStack_28 + 0x988);
    iVar3 = local_2c + 1;
    pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_58,0);
    (*pcVar1)(GVar2,iVar3,0,pvVar6);
  }
  else if (gl._4_4_ == LT_PIPELINE_OBJECT) {
    pcVar1 = *(code **)(lStack_28 + 0x998);
    iVar3 = local_2c + 1;
    pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_58,0);
    (*pcVar1)(GVar2,iVar3,0,pvVar6);
  }
  dVar4 = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(dVar4,"Could not retrieve info log!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/esextcTestCaseBase.cpp"
                  ,0x391);
  pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_58,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,pvVar6,&local_5a);
  std::allocator<char>::~allocator(&local_5a);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_58)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string TestCaseBase::getInfoLog(LOG_TYPE log_type, glw::GLuint id)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint n_characters = 0;
	/* Retrieve amount of characters needed to store the info log (terminator-inclusive) */
	switch (log_type)
	{
	case LT_SHADER_OBJECT:
		gl.getShaderiv(id, GL_INFO_LOG_LENGTH, &n_characters);
		break;
	case LT_PROGRAM_OBJECT:
		gl.getProgramiv(id, GL_INFO_LOG_LENGTH, &n_characters);
		break;
	case LT_PIPELINE_OBJECT:
		gl.getProgramPipelineiv(id, GL_INFO_LOG_LENGTH, &n_characters);
		break;
	default:
		TCU_FAIL("Invalid parameter");
	}

	/* Check if everything is fine so far */
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not query info log length!");

	/* Allocate buffer */
	std::vector<char> result_vec(n_characters + 1);

	/* Retrieve the info log */
	switch (log_type)
	{
	case LT_SHADER_OBJECT:
		gl.getShaderInfoLog(id, n_characters + 1, 0, &result_vec[0]);
		break;
	case LT_PROGRAM_OBJECT:
		gl.getProgramInfoLog(id, n_characters + 1, 0, &result_vec[0]);
		break;
	case LT_PIPELINE_OBJECT:
		gl.getProgramPipelineInfoLog(id, n_characters + 1, 0, &result_vec[0]);
		break;
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not retrieve info log!");

	return std::string(&result_vec[0]);
}